

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgbx_8888_to_xrgb_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)width;
  puVar2 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
  puVar3 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  iVar4 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    puVar1 = puVar3 + lVar5;
    for (; puVar3 < puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = *puVar2 >> 8;
      puVar2 = puVar2 + 1;
    }
    puVar2 = puVar2 + (src_pitch / 4 - lVar5);
    puVar3 = puVar3 + (dst_pitch / 4 - lVar5);
  }
  return;
}

Assistant:

static void rgbx_8888_to_xrgb_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBX_8888_TO_XRGB_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}